

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

ArrayPtr<const_kj::(anonymous_namespace)::HttpResponseTestCase>
kj::anon_unknown_0::responseTestCases(void)

{
  int iVar1;
  HeaderTestCase *pHVar2;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpResponseTestCase> AVar3;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1f8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1d8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1b8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_198;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_178;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_158;
  HttpHeaderTable *local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  HttpHeaderTable *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  HttpHeaderTable *local_118;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  HttpHeaderTable *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  HttpHeaderTable *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  Array<kj::StringPtr> local_e8;
  Array<kj::StringPtr> local_c8;
  Array<kj::StringPtr> local_a8;
  Array<kj::StringPtr> local_88;
  Array<kj::StringPtr> local_68;
  Array<kj::StringPtr> local_48;
  
  if ((anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES);
    if (iVar1 != 0) {
      uStack_f0 = 0xe;
      local_f8 = (HttpHeaderTable *)0x0;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      (pHVar2->id).table = local_f8;
      *(ulong *)&(pHVar2->id).id = CONCAT44(uStack_ec,uStack_f0);
      (pHVar2->value).content.ptr = "text/plain";
      (pHVar2->value).content.size_ = 0xb;
      local_178.size_ = 1;
      local_178.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_178.ptr = pHVar2;
      responseTestCases::RESPONSE_TEST_CASES[0].responseBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((responseTestCases::RESPONSE_TEST_CASES[0].responseBodyParts.super_Array<kj::StringPtr>.ptr)
      ->content).ptr = "baz qux";
      ((responseTestCases::RESPONSE_TEST_CASES[0].responseBodyParts.super_Array<kj::StringPtr>.ptr)
      ->content).size_ = 8;
      local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      responseTestCases::RESPONSE_TEST_CASES[0].raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Type: text/plain\r\nConnection: close\r\n\r\nbaz qux";
      responseTestCases::RESPONSE_TEST_CASES[0].raw.content.size_ = 0x48;
      responseTestCases::RESPONSE_TEST_CASES[0].statusCode = 200;
      responseTestCases::RESPONSE_TEST_CASES[0].statusText.content.ptr = "OK";
      responseTestCases::RESPONSE_TEST_CASES[0].statusText.content.size_ = 3;
      responseTestCases::RESPONSE_TEST_CASES[0].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 1;
      responseTestCases::RESPONSE_TEST_CASES[0].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_178.ptr = (HeaderTestCase *)0x0;
      local_178.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[0].responseBodySize.ptr.isSet = false;
      responseTestCases::RESPONSE_TEST_CASES[0].responseBodyParts.super_Array<kj::StringPtr>.size_ =
           1;
      responseTestCases::RESPONSE_TEST_CASES[0].responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_68.ptr = (StringPtr *)0x0;
      local_68.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[0].method = GET;
      responseTestCases::RESPONSE_TEST_CASES[0].side = CLIENT_ONLY;
      uStack_100 = 0xe;
      local_108 = (HttpHeaderTable *)0x0;
      responseTestCases::RESPONSE_TEST_CASES[0].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      (pHVar2->id).table = local_108;
      *(ulong *)&(pHVar2->id).id = CONCAT44(uStack_fc,uStack_100);
      (pHVar2->value).content.ptr = "text/plain";
      (pHVar2->value).content.size_ = 0xb;
      local_198.size_ = 1;
      local_198.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_198.ptr = pHVar2;
      responseTestCases::RESPONSE_TEST_CASES[1].responseBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_88.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      responseTestCases::RESPONSE_TEST_CASES[1].raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 123\r\nContent-Type: text/plain\r\n\r\n";
      responseTestCases::RESPONSE_TEST_CASES[1].raw.content.size_ = 0x43;
      responseTestCases::RESPONSE_TEST_CASES[1].statusCode = 200;
      responseTestCases::RESPONSE_TEST_CASES[1].statusText.content.ptr = "OK";
      responseTestCases::RESPONSE_TEST_CASES[1].statusText.content.size_ = 3;
      responseTestCases::RESPONSE_TEST_CASES[1].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 1;
      responseTestCases::RESPONSE_TEST_CASES[1].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_198.ptr = (HeaderTestCase *)0x0;
      local_198.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[1].responseBodySize.ptr.isSet = true;
      responseTestCases::RESPONSE_TEST_CASES[1].responseBodySize.ptr.field_1.value = 0x7b;
      responseTestCases::RESPONSE_TEST_CASES[1].responseBodyParts.super_Array<kj::StringPtr>.size_ =
           0;
      responseTestCases::RESPONSE_TEST_CASES[1].responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_88.ptr = (StringPtr *)0x0;
      local_88.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[1].method = HEAD;
      responseTestCases::RESPONSE_TEST_CASES[1].side = BOTH;
      local_118 = (HttpHeaderTable *)0x0;
      uStack_110 = 0xe;
      responseTestCases::RESPONSE_TEST_CASES[1].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      (pHVar2->id).table = local_118;
      *(ulong *)&(pHVar2->id).id = CONCAT44(uStack_10c,uStack_110);
      (pHVar2->value).content.ptr = "text/plain";
      (pHVar2->value).content.size_ = 0xb;
      pHVar2[1].id.table = (HttpHeaderTable *)0x0;
      pHVar2[1].id.id = 5;
      pHVar2[1].value.content.ptr = "foobar";
      pHVar2[1].value.content.size_ = 7;
      local_1b8.size_ = 2;
      local_1b8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1b8.ptr = pHVar2;
      responseTestCases::RESPONSE_TEST_CASES[2].responseBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_a8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      responseTestCases::RESPONSE_TEST_CASES[2].raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: foobar\r\nContent-Type: text/plain\r\n\r\n";
      responseTestCases::RESPONSE_TEST_CASES[2].raw.content.size_ = 0x46;
      responseTestCases::RESPONSE_TEST_CASES[2].statusCode = 200;
      responseTestCases::RESPONSE_TEST_CASES[2].statusText.content.ptr = "OK";
      responseTestCases::RESPONSE_TEST_CASES[2].statusText.content.size_ = 3;
      responseTestCases::RESPONSE_TEST_CASES[2].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 2;
      responseTestCases::RESPONSE_TEST_CASES[2].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1b8.ptr = (HeaderTestCase *)0x0;
      local_1b8.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[2].responseBodySize.ptr.isSet = true;
      responseTestCases::RESPONSE_TEST_CASES[2].responseBodySize.ptr.field_1.value = 0x7b;
      responseTestCases::RESPONSE_TEST_CASES[2].responseBodyParts.super_Array<kj::StringPtr>.size_ =
           0;
      responseTestCases::RESPONSE_TEST_CASES[2].responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_a8.ptr = (StringPtr *)0x0;
      local_a8.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[2].method = HEAD;
      responseTestCases::RESPONSE_TEST_CASES[2].side = BOTH;
      responseTestCases::RESPONSE_TEST_CASES[2].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_1d8.size_ = 0;
      local_1d8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1d8.ptr = pHVar2;
      responseTestCases::RESPONSE_TEST_CASES[3].responseBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      local_c8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      responseTestCases::RESPONSE_TEST_CASES[3].raw.content.ptr = "HTTP/1.1 200 OK\r\n\r\n";
      responseTestCases::RESPONSE_TEST_CASES[3].raw.content.size_ = 0x14;
      responseTestCases::RESPONSE_TEST_CASES[3].statusCode = 200;
      responseTestCases::RESPONSE_TEST_CASES[3].statusText.content.ptr = "OK";
      responseTestCases::RESPONSE_TEST_CASES[3].statusText.content.size_ = 3;
      responseTestCases::RESPONSE_TEST_CASES[3].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[3].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1d8.ptr = (HeaderTestCase *)0x0;
      local_1d8.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[3].responseBodySize.ptr.isSet = true;
      responseTestCases::RESPONSE_TEST_CASES[3].responseBodySize.ptr.field_1.value = 0;
      responseTestCases::RESPONSE_TEST_CASES[3].responseBodyParts.super_Array<kj::StringPtr>.size_ =
           0;
      responseTestCases::RESPONSE_TEST_CASES[3].responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_c8.ptr = (StringPtr *)0x0;
      local_c8.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[3].method = HEAD;
      responseTestCases::RESPONSE_TEST_CASES[3].side = BOTH;
      uStack_120 = 0xe;
      local_128 = (HttpHeaderTable *)0x0;
      responseTestCases::RESPONSE_TEST_CASES[3].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      (pHVar2->id).table = local_128;
      *(ulong *)&(pHVar2->id).id = CONCAT44(uStack_11c,uStack_120);
      (pHVar2->value).content.ptr = "text/plain";
      (pHVar2->value).content.size_ = 0xb;
      local_1f8.size_ = 1;
      local_1f8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1f8.ptr = pHVar2;
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.ptr)
      ->content).ptr = "qux";
      ((responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.ptr)
      ->content).size_ = 4;
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.ptr[1].
      content.ptr = "corge";
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.ptr[1].
      content.size_ = 6;
      local_e8.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      responseTestCases::RESPONSE_TEST_CASES[4].raw.content.ptr =
           "HTTP/1.1 200 OK\r\nContent-Length: 8\r\nContent-Type: text/plain\r\n\r\nquxcorge";
      responseTestCases::RESPONSE_TEST_CASES[4].raw.content.size_ = 0x49;
      responseTestCases::RESPONSE_TEST_CASES[4].statusCode = 200;
      responseTestCases::RESPONSE_TEST_CASES[4].statusText.content.ptr = "OK";
      responseTestCases::RESPONSE_TEST_CASES[4].statusText.content.size_ = 3;
      responseTestCases::RESPONSE_TEST_CASES[4].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 1;
      responseTestCases::RESPONSE_TEST_CASES[4].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_1f8.ptr = (HeaderTestCase *)0x0;
      local_1f8.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodySize.ptr.isSet = true;
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodySize.ptr.field_1.value = 8;
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.size_ =
           2;
      responseTestCases::RESPONSE_TEST_CASES[4].responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_e8.ptr = (StringPtr *)0x0;
      local_e8.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[4].method = GET;
      responseTestCases::RESPONSE_TEST_CASES[4].side = BOTH;
      uStack_130 = 0xe;
      local_138 = (HttpHeaderTable *)0x0;
      responseTestCases::RESPONSE_TEST_CASES[4].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      pHVar2 = (HeaderTestCase *)
               _::HeapArrayDisposer::allocateImpl
                         (0x20,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      (pHVar2->id).table = local_138;
      *(ulong *)&(pHVar2->id).id = CONCAT44(uStack_12c,uStack_130);
      (pHVar2->value).content.ptr = "text/plain";
      (pHVar2->value).content.size_ = 0xb;
      local_158.size_ = 1;
      local_158.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_158.ptr = pHVar2;
      responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.ptr =
           (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
      ((responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.ptr)
      ->content).ptr = "qux";
      ((responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.ptr)
      ->content).size_ = 4;
      responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.ptr[1].
      content.ptr = "corge";
      responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.ptr[1].
      content.size_ = 6;
      local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      responseTestCases::RESPONSE_TEST_CASES[5].raw.content.ptr =
           "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\nContent-Type: text/plain\r\n\r\n3\r\nqux\r\n5\r\ncorge\r\n0\r\n\r\n"
      ;
      responseTestCases::RESPONSE_TEST_CASES[5].raw.content.size_ = 0x61;
      responseTestCases::RESPONSE_TEST_CASES[5].statusCode = 200;
      responseTestCases::RESPONSE_TEST_CASES[5].statusText.content.ptr = "OK";
      responseTestCases::RESPONSE_TEST_CASES[5].statusText.content.size_ = 3;
      responseTestCases::RESPONSE_TEST_CASES[5].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.size_ = 1;
      responseTestCases::RESPONSE_TEST_CASES[5].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.disposer =
           (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_158.ptr = (HeaderTestCase *)0x0;
      local_158.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[5].responseBodySize.ptr.isSet = false;
      responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.size_ =
           2;
      responseTestCases::RESPONSE_TEST_CASES[5].responseBodyParts.super_Array<kj::StringPtr>.
      disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      local_48.ptr = (StringPtr *)0x0;
      local_48.size_ = 0;
      responseTestCases::RESPONSE_TEST_CASES[5].method = GET;
      responseTestCases::RESPONSE_TEST_CASES[5].side = BOTH;
      responseTestCases::RESPONSE_TEST_CASES[5].responseHeaders.
      super_Array<kj::(anonymous_namespace)::HeaderTestCase>.ptr = pHVar2;
      Array<kj::StringPtr>::~Array(&local_48);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_158);
      Array<kj::StringPtr>::~Array(&local_e8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1f8);
      Array<kj::StringPtr>::~Array(&local_c8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1d8);
      Array<kj::StringPtr>::~Array(&local_a8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1b8);
      Array<kj::StringPtr>::~Array(&local_88);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_198);
      Array<kj::StringPtr>::~Array(&local_68);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_178);
      __cxa_atexit(__cxx_global_array_dtor_460,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES);
    }
  }
  AVar3.size_ = 6;
  AVar3.ptr = responseTestCases::RESPONSE_TEST_CASES;
  return AVar3;
}

Assistant:

kj::ArrayPtr<const HttpResponseTestCase> responseTestCases() {
  static const HttpResponseTestCase RESPONSE_TEST_CASES[] {
    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Type: text/plain\r\n"
      "Connection: close\r\n"
      "\r\n"
      "baz qux",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      nullptr, {"baz qux"},

      HttpMethod::GET,
      CLIENT_ONLY,   // Server never sends connection: close
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: 123\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      123, {},

      HttpMethod::HEAD,
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: foobar\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"},
       {HttpHeaderId::CONTENT_LENGTH, "foobar"}},
      123, {},

      HttpMethod::HEAD,
    },

    // Zero-length expected size response to HEAD request has no Content-Length header.
    {
      "HTTP/1.1 200 OK\r\n"
      "\r\n",

      200, "OK",
      {},
      uint64_t(0), {},

      HttpMethod::HEAD,
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: 8\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n"
      "quxcorge",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      8, { "qux", "corge" }
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Transfer-Encoding: chunked\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n"
      "3\r\n"
      "qux\r\n"
      "5\r\n"
      "corge\r\n"
      "0\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      nullptr, { "qux", "corge" }
    },
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents RESPONSE_TEST_CASES from implicitly
  //   casting to our return type.
  return kj::arrayPtr(RESPONSE_TEST_CASES, kj::size(RESPONSE_TEST_CASES));
}